

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O0

PyObject * libxml_xmlStringDecodeEntities(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *local_58;
  undefined1 local_4f;
  undefined1 local_4e;
  undefined1 local_4d;
  undefined4 local_4c;
  xmlChar end3;
  xmlChar end2;
  xmlChar end;
  undefined8 uStack_48;
  int what;
  xmlChar *str;
  PyObject *pyobj_ctxt;
  xmlParserCtxtPtr ctxt;
  xmlChar *c_retval;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = libxml_deprecationWarning("xmlStringDecodeEntities");
  if (iVar1 == -1) {
    self_local = (PyObject *)0x0;
  }
  else {
    iVar1 = _PyArg_ParseTuple_SizeT
                      (py_retval,"Oziccc:xmlStringDecodeEntities",&str,&stack0xffffffffffffffb8,
                       &local_4c,&local_4d,&local_4e,&local_4f);
    if (iVar1 == 0) {
      self_local = (PyObject *)0x0;
    }
    else {
      if (str == &_Py_NoneStruct) {
        local_58 = (PyObject *)0x0;
      }
      else {
        local_58 = *(PyObject **)(str + 0x10);
      }
      pyobj_ctxt = local_58;
      ctxt = (xmlParserCtxtPtr)
             xmlStringDecodeEntities(local_58,uStack_48,local_4c,local_4d,local_4e,local_4f);
      self_local = libxml_xmlCharPtrWrap((xmlChar *)ctxt);
    }
  }
  return self_local;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlStringDecodeEntities(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    xmlChar * c_retval;
    xmlParserCtxtPtr ctxt;
    PyObject *pyobj_ctxt;
    xmlChar * str;
    int what;
    xmlChar end;
    xmlChar end2;
    xmlChar end3;

    if (libxml_deprecationWarning("xmlStringDecodeEntities") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"Oziccc:xmlStringDecodeEntities", &pyobj_ctxt, &str, &what, &end, &end2, &end3))
        return(NULL);
    ctxt = (xmlParserCtxtPtr) PyparserCtxt_Get(pyobj_ctxt);

    c_retval = xmlStringDecodeEntities(ctxt, str, what, end, end2, end3);
    py_retval = libxml_xmlCharPtrWrap((xmlChar *) c_retval);
    return(py_retval);
}